

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_sx_w32n_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i v;
  undefined1 auVar3 [32];
  void *in_RSI;
  long in_R8;
  uint in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 in_YMM0_H;
  void *a;
  undefined8 in_register_00001218;
  undefined1 auVar10 [16];
  undefined1 auVar6 [16];
  undefined8 uVar9;
  undefined8 uVar11;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long in_stack_00000008;
  __m256i v_m1_b;
  __m256i v_m0_b;
  __m256i v_ah_b;
  __m256i v_al_b;
  __m256i v_r1_s_b;
  __m256i v_r0_s_b;
  __m256i v_r1_b;
  __m256i v_r0_b;
  int c;
  __m256i v_maxval_b;
  __m256i v_shuffle_b;
  undefined1 in_stack_fffffffffffffc20 [24];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3a8;
  int local_284;
  long local_230;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  
  yy_loadu_256((__m256i *)"",in_RSI);
  auVar5 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar5 = vpinsrb_avx(auVar5,0x40,2);
  auVar5 = vpinsrb_avx(auVar5,0x40,3);
  auVar5 = vpinsrb_avx(auVar5,0x40,4);
  auVar5 = vpinsrb_avx(auVar5,0x40,5);
  auVar5 = vpinsrb_avx(auVar5,0x40,6);
  auVar5 = vpinsrb_avx(auVar5,0x40,7);
  auVar5 = vpinsrb_avx(auVar5,0x40,8);
  auVar5 = vpinsrb_avx(auVar5,0x40,9);
  auVar5 = vpinsrb_avx(auVar5,0x40,10);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xb);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xc);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xd);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xe);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xf);
  auVar10 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar10 = vpinsrb_avx(auVar10,0x40,2);
  auVar10 = vpinsrb_avx(auVar10,0x40,3);
  auVar10 = vpinsrb_avx(auVar10,0x40,4);
  auVar10 = vpinsrb_avx(auVar10,0x40,5);
  auVar10 = vpinsrb_avx(auVar10,0x40,6);
  auVar10 = vpinsrb_avx(auVar10,0x40,7);
  auVar10 = vpinsrb_avx(auVar10,0x40,8);
  auVar10 = vpinsrb_avx(auVar10,0x40,9);
  auVar10 = vpinsrb_avx(auVar10,0x40,10);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xb);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xc);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xd);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xe);
  auVar10 = vpinsrb_avx(auVar10,0x40,0xf);
  auVar4 = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar10;
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  uStack_1f0 = auVar10._0_8_;
  uStack_1e8 = auVar10._8_8_;
  local_230 = in_R8;
  auVar5 = auVar4;
  do {
    for (local_284 = 0; local_284 < (int)mask_stride; local_284 = local_284 + 0x20) {
      yy_loadu_256((__m256i *)(in_stack_00000008 + local_284 * 2),in_RSI);
      uVar11 = auVar10._8_8_;
      uVar9 = auVar10._0_8_;
      auVar6 = auVar5;
      yy_loadu_256((__m256i *)(in_stack_00000008 + 0x20 + (long)(local_284 * 2)),in_RSI);
      auVar3._16_8_ = uVar9;
      auVar3._0_16_ = auVar5;
      auVar3._24_8_ = uVar11;
      auVar1._8_8_ = in_XMM0_Qb;
      auVar1._0_8_ = in_XMM0_Qa;
      auVar1._16_8_ = in_YMM0_H;
      auVar1._24_8_ = in_register_00001218;
      auVar1 = vpshufb_avx2(auVar3,auVar1);
      auVar8._16_8_ = auVar10._0_8_;
      auVar8._0_16_ = auVar6;
      auVar8._24_8_ = auVar10._8_8_;
      auVar7._8_8_ = in_XMM0_Qb;
      auVar7._0_8_ = in_XMM0_Qa;
      auVar7._16_8_ = in_YMM0_H;
      auVar7._24_8_ = in_register_00001218;
      auVar2 = vpshufb_avx2(auVar8,auVar7);
      auVar7 = vpsrldq_avx2(auVar1,8);
      auVar7 = vpavgb_avx2(auVar1,auVar7);
      auVar8 = vpsrldq_avx2(auVar2,8);
      auVar2 = vpavgb_avx2(auVar2,auVar8);
      auVar7 = vpunpcklqdq_avx2(auVar7,auVar2);
      auVar7 = vpermq_avx2(auVar7,0xd8);
      auVar2._16_8_ = uStack_1f0;
      auVar2._0_16_ = auVar4;
      auVar2._24_8_ = uStack_1e8;
      auVar7 = vpsubb_avx2(auVar2,auVar7);
      in_RSI = (void *)(local_230 + local_284);
      blend_32_u8_avx2(auVar10._0_8_,auVar6._8_8_,auVar6._0_8_,auVar1._24_8_,auVar1._20_4_);
      local_3c0 = auVar7._0_8_;
      uStack_3b8 = auVar7._8_8_;
      a = auVar7._16_8_;
      uStack_3a8 = auVar7._24_8_;
      v[1] = in_stack_fffffffffffffc20._0_8_;
      v[2] = in_stack_fffffffffffffc20._8_8_;
      v[3] = in_stack_fffffffffffffc20._16_8_;
      v[0] = 0x5f6b89;
      yy_storeu_256(a,v);
      auVar10._8_8_ = uStack_3a8;
      auVar10._0_8_ = a;
      auVar5._8_8_ = uStack_3b8;
      auVar5._0_8_ = local_3c0;
    }
    local_230 = local_230 + (ulong)in_R9D;
    in_stack_00000008 = in_stack_00000008 + ((ulong)mask & 0xffffffff);
    w = w + -1;
  } while (w != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_sx_w32n_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m256i v_shuffle_b = yy_loadu_256(g_blend_a64_mask_shuffle);
  const __m256i v_maxval_b = _mm256_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  do {
    int c;
    for (c = 0; c < w; c += 32) {
      const __m256i v_r0_b = yy_loadu_256(mask + 2 * c);
      const __m256i v_r1_b = yy_loadu_256(mask + 2 * c + 32);
      const __m256i v_r0_s_b = _mm256_shuffle_epi8(v_r0_b, v_shuffle_b);
      const __m256i v_r1_s_b = _mm256_shuffle_epi8(v_r1_b, v_shuffle_b);
      const __m256i v_al_b =
          _mm256_avg_epu8(v_r0_s_b, _mm256_srli_si256(v_r0_s_b, 8));
      const __m256i v_ah_b =
          _mm256_avg_epu8(v_r1_s_b, _mm256_srli_si256(v_r1_s_b, 8));

      const __m256i v_m0_b =
          _mm256_permute4x64_epi64(_mm256_unpacklo_epi64(v_al_b, v_ah_b), 0xd8);
      const __m256i v_m1_b = _mm256_sub_epi8(v_maxval_b, v_m0_b);

      const __m256i v_res_b = blend_32_u8_avx2(
          src0 + c, src1 + c, &v_m0_b, &v_m1_b, AOM_BLEND_A64_ROUND_BITS);

      yy_storeu_256(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}